

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool test_ok;
  int *in_stack_00000020;
  int *in_stack_00000028;
  _func_void_int_ptr_int *in_stack_00000030;
  int *in_stack_00000038;
  _func_void_int_ptr_int *in_stack_00000040;
  bool local_12;
  uint local_4;
  
  uVar1 = std::thread::hardware_concurrency();
  if (uVar1 < 2) {
    std::operator<<((ostream *)&std::cout,"TEST SKIPPED (requires 2 HW threads)\n");
    local_4 = 0;
  }
  else {
    t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    depspawn::spawn<void(int_volatile&),int&>
              ((_func_void_int_ptr *)in_stack_00000030,in_stack_00000028);
    i = 0x14;
    depspawn::spawn<void(int&,int),int&,int>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    depspawn::spawn<void(int&,int),int&,int&>
              (in_stack_00000040,in_stack_00000038,(int *)in_stack_00000030);
    depspawn::wait_for_all();
    poVar2 = std::operator<<((ostream *)&std::cout,"Final i=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
    poVar2 = std::operator<<(poVar2," j=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,j);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar4 = i == 0x14;
    bVar5 = j == 0x14;
    local_12 = bVar4 && bVar5;
    poVar2 = std::operator<<((ostream *)&std::cout,"TEST ");
    pcVar3 = "UNSUCCESSFUL";
    if (bVar4 && bVar5) {
      pcVar3 = "SUCCESSFUL";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = (uint)((local_12 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

int main()
{
  
  if (std::thread::hardware_concurrency() < 2 ) {
    std::cout << "TEST SKIPPED (requires 2 HW threads)\n";
    return 0;
  }

  t0 = std::chrono::high_resolution_clock::now();

  spawn(f, i);      //f runs for long. Sets i=10
  
  i = 20;
  
  // Because of the use of std::move(i)
  // (1) h does not depend on f and thus does not wait for it
  // (2) h uses the inmediate value of i(20)
  spawn(h, j, std::move(i));
  
  // Although i was set to 20, f sets it to 10 much later
  // h proves that although the second argument (s) is passed by value,
  // it is binded/provided to the function ONLY after f finishes, thus
  // adquiring the value 10, not 20
  spawn(h, i, i);
  
  wait_for_all();

  std::cout << "Final i=" << i << " j=" << j << std::endl;
  
  const bool test_ok = (i == 20) && (j == 20);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}